

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssdp_ctrlpt.c
# Opt level: O3

void searchExpired(void *arg)

{
  UpnpClient_Handle Hnd;
  int iVar1;
  Upnp_FunPtr p_Var2;
  int *__ptr;
  void *pvVar3;
  Upnp_Handle_Type UVar4;
  ListNode *dnode;
  ListNode *pLVar5;
  int in_ESI;
  int line;
  Handle_Info *ctrlpt_info;
  Handle_Info *local_38;
  
  line = (int)&local_38;
  Hnd = *arg;
  iVar1 = *(int *)((long)arg + 4);
  local_38 = (Handle_Info *)0x0;
  HandleLock((char *)0x21e,in_ESI);
  UVar4 = GetHandleInfo(Hnd,&local_38);
  if (UVar4 == HND_CLIENT) {
    p_Var2 = local_38->Callback;
    dnode = ListHead(&local_38->SsdpSearchList);
    while (dnode != (ListNode *)0x0) {
      __ptr = (int *)dnode->item;
      if (*__ptr == iVar1) {
        free(*(void **)(__ptr + 2));
        pvVar3 = *(void **)(__ptr + 4);
        free(__ptr);
        ListDelNode(&local_38->SsdpSearchList,dnode,0);
        HandleUnlock((char *)0x235,(int)dnode);
        (*p_Var2)(UPNP_DISCOVERY_SEARCH_TIMEOUT,(void *)0x0,pvVar3);
        goto LAB_001284cc;
      }
      pLVar5 = ListNext(&local_38->SsdpSearchList,dnode);
      line = (int)dnode;
      dnode = pLVar5;
    }
    HandleUnlock((char *)0x235,line);
LAB_001284cc:
    free(arg);
  }
  else {
    free(arg);
    HandleUnlock((char *)0x223,line);
  }
  return;
}

Assistant:

static void searchExpired(
	/* [in] . */
	void *arg)
{
	int id = ((SsdpSearchExpArg *)arg)->timeoutEventId;
	int handle = ((SsdpSearchExpArg *)arg)->handle;
	struct Handle_Info *ctrlpt_info = NULL;

	/* remove search Target from list and call client back */
	ListNode *node = NULL;
	SsdpSearchArg *item;
	Upnp_FunPtr ctrlpt_callback;
	void *cookie = NULL;
	int found = 0;

	HandleLock(__FILE__, __LINE__);

	/* remove search target from search list */
	if (GetHandleInfo(handle, &ctrlpt_info) != HND_CLIENT) {
		free(arg);
		HandleUnlock(__FILE__, __LINE__);
		return;
	}
	ctrlpt_callback = ctrlpt_info->Callback;
	node = ListHead(&ctrlpt_info->SsdpSearchList);
	while (node != NULL) {
		item = (SsdpSearchArg *)node->item;
		if (item->timeoutEventId == id) {
			free(item->searchTarget);
			cookie = item->cookie;
			found = 1;
			item->searchTarget = NULL;
			free(item);
			ListDelNode(&ctrlpt_info->SsdpSearchList, node, 0);
			break;
		}
		node = ListNext(&ctrlpt_info->SsdpSearchList, node);
	}
	HandleUnlock(__FILE__, __LINE__);

	if (found)
		ctrlpt_callback(UPNP_DISCOVERY_SEARCH_TIMEOUT, NULL, cookie);

	free(arg);
}